

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

uint32_t __thiscall
diligent_spirv_cross::Compiler::get_execution_mode_argument
          (Compiler *this,ExecutionMode mode,uint32_t index)

{
  _Hash_node_base *p_Var1;
  __node_base_ptr p_Var2;
  SPIRConstant *pSVar3;
  ulong uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  
  uVar4 = (ulong)(this->ir).default_entry_point.id;
  uVar5 = 0;
  p_Var2 = ::std::
           _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->ir).entry_points._M_h,
                      uVar4 % (this->ir).entry_points._M_h._M_bucket_count,
                      &(this->ir).default_entry_point,uVar4);
  p_Var1 = p_Var2->_M_nxt;
  if ((int)mode < 0x1a) {
    if (mode == ExecutionModeInvocations) {
      uVar6 = *(uint32_t *)((long)&p_Var1[0x1d]._M_nxt + 4);
    }
    else {
      uVar6 = uVar5;
      if (mode == ExecutionModeLocalSize) {
        if (index == 2) {
          if ((((ulong)p_Var1[0x12]._M_nxt & 0x4000000000) == 0) ||
             (uVar4 = (ulong)*(uint *)((long)&p_Var1[0x1c]._M_nxt + 4), uVar4 == 0)) {
            return *(uint32_t *)&p_Var1[0x1b]._M_nxt;
          }
        }
        else if (index == 1) {
          if ((((ulong)p_Var1[0x12]._M_nxt & 0x4000000000) == 0) ||
             (uVar4 = (ulong)*(uint *)&p_Var1[0x1c]._M_nxt, uVar4 == 0)) {
            return *(uint32_t *)((long)&p_Var1[0x1a]._M_nxt + 4);
          }
        }
        else {
          if (index != 0) {
            return 0;
          }
          if ((((ulong)p_Var1[0x12]._M_nxt & 0x4000000000) == 0) ||
             (uVar4 = (ulong)*(uint *)((long)&p_Var1[0x1b]._M_nxt + 4), uVar4 == 0)) {
            return *(uint32_t *)&p_Var1[0x1a]._M_nxt;
          }
        }
        pSVar3 = Variant::get<diligent_spirv_cross::SPIRConstant>
                           ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                            uVar4);
        uVar6 = (pSVar3->m).c[0].r[0].u32;
      }
    }
  }
  else if (mode == ExecutionModeOutputVertices) {
    uVar6 = *(uint32_t *)&p_Var1[0x1e]._M_nxt;
  }
  else if (mode == ExecutionModeOutputPrimitivesEXT) {
    uVar6 = *(uint32_t *)((long)&p_Var1[0x1e]._M_nxt + 4);
  }
  else {
    uVar6 = 0;
    if ((mode == ExecutionModeLocalSizeId) &&
       (uVar6 = uVar5, ((ulong)p_Var1[0x12]._M_nxt & 0x4000000000) != 0)) {
      if (index == 2) {
        uVar6 = *(uint32_t *)((long)&p_Var1[0x1c]._M_nxt + 4);
      }
      else if (index == 1) {
        uVar6 = *(uint32_t *)&p_Var1[0x1c]._M_nxt;
      }
      else if (index == 0) {
        uVar6 = *(uint32_t *)((long)&p_Var1[0x1b]._M_nxt + 4);
      }
    }
  }
  return uVar6;
}

Assistant:

uint32_t Compiler::get_execution_mode_argument(spv::ExecutionMode mode, uint32_t index) const
{
	auto &execution = get_entry_point();
	switch (mode)
	{
	case ExecutionModeLocalSizeId:
		if (execution.flags.get(ExecutionModeLocalSizeId))
		{
			switch (index)
			{
			case 0:
				return execution.workgroup_size.id_x;
			case 1:
				return execution.workgroup_size.id_y;
			case 2:
				return execution.workgroup_size.id_z;
			default:
				return 0;
			}
		}
		else
			return 0;

	case ExecutionModeLocalSize:
		switch (index)
		{
		case 0:
			if (execution.flags.get(ExecutionModeLocalSizeId) && execution.workgroup_size.id_x != 0)
				return get<SPIRConstant>(execution.workgroup_size.id_x).scalar();
			else
				return execution.workgroup_size.x;
		case 1:
			if (execution.flags.get(ExecutionModeLocalSizeId) && execution.workgroup_size.id_y != 0)
				return get<SPIRConstant>(execution.workgroup_size.id_y).scalar();
			else
				return execution.workgroup_size.y;
		case 2:
			if (execution.flags.get(ExecutionModeLocalSizeId) && execution.workgroup_size.id_z != 0)
				return get<SPIRConstant>(execution.workgroup_size.id_z).scalar();
			else
				return execution.workgroup_size.z;
		default:
			return 0;
		}

	case ExecutionModeInvocations:
		return execution.invocations;

	case ExecutionModeOutputVertices:
		return execution.output_vertices;

	case ExecutionModeOutputPrimitivesEXT:
		return execution.output_primitives;

	default:
		return 0;
	}
}